

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void Assimp::ExportScene3MF
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  aiScene *paVar1;
  IOSystem *pIVar2;
  bool bVar3;
  byte bVar4;
  DeadlyImportError *pDVar5;
  allocator<char> local_5f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  undefined1 local_5b3;
  undefined1 local_5b2;
  allocator<char> local_5b1;
  undefined1 local_5b0 [5];
  bool ok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  allocator<char> local_569;
  string local_568 [32];
  undefined1 local_548 [8];
  D3MFExporter myExporter;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ExportProperties *local_28;
  ExportProperties *param_3_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  local_28 = param_4;
  param_3_local = (ExportProperties *)pScene;
  pScene_local = (aiScene *)pIOSystem;
  pIOSystem_local = (IOSystem *)pFile;
  if (pIOSystem == (IOSystem *)0x0) {
    myExporter.mRelations.
    super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    pIVar2 = pIOSystem_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,(char *)pIVar2,&local_69)
    ;
    std::operator+(&local_48,"Could not export 3MP archive: ",&local_68);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_48);
    myExporter.mRelations.
    super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  D3MF::D3MFExporter::D3MFExporter((D3MFExporter *)local_548,pFile,pScene);
  bVar3 = D3MF::D3MFExporter::validate((D3MFExporter *)local_548);
  if (bVar3) {
    bVar4 = (**(code **)(*(long *)pScene_local + 0x10))(pScene_local,pIOSystem_local);
    pIVar2 = pIOSystem_local;
    paVar1 = pScene_local;
    if ((bVar4 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_568,(char *)pIVar2,&local_569);
      bVar4 = (**(code **)(*(long *)paVar1 + 0x68))(paVar1,local_568);
      std::__cxx11::string::~string(local_568);
      std::allocator<char>::~allocator(&local_569);
      if (((bVar4 ^ 0xff) & 1) != 0) {
        local_5b2 = 1;
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        pIVar2 = pIOSystem_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_5b0,(char *)pIVar2,&local_5b1);
        std::operator+(&local_590,"File exists, cannot override : ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5b0);
        DeadlyImportError::DeadlyImportError(pDVar5,&local_590);
        local_5b2 = 0;
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
    }
    local_5b3 = D3MF::D3MFExporter::exportArchive((D3MFExporter *)local_548,(char *)pIOSystem_local)
    ;
    if (!(bool)local_5b3) {
      pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      pIVar2 = pIOSystem_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f8,(char *)pIVar2,&local_5f9);
      std::operator+(&local_5d8,"Could not export 3MP archive: ",&local_5f8);
      DeadlyImportError::DeadlyImportError(pDVar5,&local_5d8);
      __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  D3MF::D3MFExporter::~D3MFExporter((D3MFExporter *)local_548);
  return;
}

Assistant:

void ExportScene3MF( const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/ ) {
    if ( nullptr == pIOSystem ) {
        throw DeadlyExportError( "Could not export 3MP archive: " + std::string( pFile ) );
    }
    D3MF::D3MFExporter myExporter( pFile, pScene );
    if ( myExporter.validate() ) {
        if ( pIOSystem->Exists( pFile ) ) {
            if ( !pIOSystem->DeleteFile( pFile ) ) {
                throw DeadlyExportError( "File exists, cannot override : " + std::string( pFile ) );
            }
        }
        bool ok = myExporter.exportArchive(pFile);
        if ( !ok ) {
            throw DeadlyExportError( "Could not export 3MP archive: " + std::string( pFile ) );
        }
    }
}